

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

CoverageOptionSyntax * __thiscall
slang::parsing::Parser::parseCoverageOption(Parser *this,AttrList attributes)

{
  SyntaxNode *this_00;
  NameSyntax *pNVar1;
  SyntaxNode *this_01;
  BinaryExpressionSyntax *pBVar2;
  ScopedNameSyntax *pSVar3;
  CoverageOptionSyntax *pCVar4;
  char *func;
  string_view sVar5;
  SourceRange range;
  Token semi;
  Token token;
  Token local_70;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_60;
  
  local_70 = ParserBase::peek(&this->super_ParserBase);
  if (local_70.kind != Identifier) {
    return (CoverageOptionSyntax *)0x0;
  }
  sVar5 = Token::valueText(&local_70);
  if ((sVar5._M_len != 6) ||
     ((short)*(int *)((long)sVar5._M_str + 4) != 0x6e6f || *(int *)sVar5._M_str != 0x6974706f)) {
    sVar5 = Token::valueText(&local_70);
    if (sVar5._M_len != 0xb) {
      return (CoverageOptionSyntax *)0x0;
    }
    if (*(long *)((long)sVar5._M_str + 3) != 0x6e6f6974706f5f65 ||
        *(long *)sVar5._M_str != 0x74706f5f65707974) {
      return (CoverageOptionSyntax *)0x0;
    }
  }
  this_01 = &parseExpression(this)->super_SyntaxNode;
  if (this_01->kind == AssignmentExpression) {
    pBVar2 = slang::syntax::SyntaxNode::as<slang::syntax::BinaryExpressionSyntax>(this_01);
    this_00 = &((pBVar2->left).ptr)->super_SyntaxNode;
    if (this_00 == (SyntaxNode *)0x0) {
      func = 
      "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
      ;
      goto LAB_00345a27;
    }
    if (this_00->kind == ScopedName) {
      pSVar3 = slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(this_00);
      pNVar1 = (pSVar3->left).ptr;
      if (pNVar1 == (NameSyntax *)0x0) {
LAB_00345a12:
        func = 
        "T slang::not_null<slang::syntax::NameSyntax *>::get() const [T = slang::syntax::NameSyntax *]"
        ;
LAB_00345a27:
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,func);
      }
      if ((pNVar1->super_ExpressionSyntax).super_SyntaxNode.kind == IdentifierName) {
        pNVar1 = (pSVar3->right).ptr;
        if (pNVar1 == (NameSyntax *)0x0) goto LAB_00345a12;
        if ((pNVar1->super_ExpressionSyntax).super_SyntaxNode.kind == IdentifierName)
        goto LAB_003459a3;
      }
    }
  }
  range = slang::syntax::SyntaxNode::sourceRange(this_01);
  ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x540005,range);
LAB_003459a3:
  local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_60.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00508348;
  local_60.super_SyntaxListBase.childCount = attributes.size_;
  local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       attributes.data_;
  local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ =
       attributes.size_;
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pCVar4 = slang::syntax::SyntaxFactory::coverageOption
                     (&this->factory,&local_60,(ExpressionSyntax *)this_01,semi);
  return pCVar4;
}

Assistant:

CoverageOptionSyntax* Parser::parseCoverageOption(AttrList attributes) {
    auto token = peek();
    if (token.kind == TokenKind::Identifier) {
        if (token.valueText() == "option" || token.valueText() == "type_option") {
            auto& expr = parseExpression();
            if (!isValidOption(expr))
                addDiag(diag::InvalidCoverageOption, expr.sourceRange());

            return &factory.coverageOption(attributes, expr, expect(TokenKind::Semicolon));
        }
    }
    return nullptr;
}